

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TgNextPermutation(Abc_TgMan_t *pMan)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  
  if (0 < pMan->nGroups) {
    lVar11 = 0;
    do {
      cVar1 = pMan->pGroup[lVar11].nGVars;
      uVar12 = (uint)cVar1;
      if (uVar12 != 1) {
        lVar8 = (long)pMan->pGroup[lVar11].iStart;
        lVar2 = lVar8 + 0x1c;
        pcVar9 = pMan->pPermDir + lVar8;
        uVar10 = (ulong)uVar12;
        if (cVar1 < '\x01') {
          uVar5 = 0;
        }
        else {
          uVar3 = 0xffffffff;
          uVar5 = 0;
          do {
            uVar7 = (int)pcVar9[uVar5] + (uint)uVar5;
            if (((uVar7 < uVar12) &&
                (pMan->pPerm[(ulong)uVar7 + lVar2 + -0x1c] < pcVar9[uVar5 - 0x30])) &&
               (((int)uVar3 < 0 ||
                (pMan->pPerm[(ulong)uVar3 + lVar2 + -0x1c] < pcVar9[uVar5 - 0x30])))) {
              uVar3 = (uint)uVar5;
            }
            uVar5 = uVar5 + 1;
          } while (uVar10 != uVar5);
          uVar5 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar5 = 0;
          }
          uVar6 = 0;
          do {
            if (pMan->pPerm[uVar5 + lVar2 + -0x1c] < pcVar9[uVar6 - 0x30]) {
              pcVar9[uVar6] = -pcVar9[uVar6];
            }
            uVar6 = uVar6 + 1;
          } while (uVar10 != uVar6);
        }
        uVar12 = (int)pcVar9[uVar5] + (int)uVar5;
        if (-1 < (int)uVar12) {
          if ((int)uVar12 < (int)uVar5) {
            uVar5 = (ulong)uVar12;
          }
          Abc_TgSwapAdjacentSymGroups(pMan,(int)pMan->pGroup[lVar11].iStart + (int)uVar5);
          return 1;
        }
        Abc_TgSwapAdjacentSymGroups(pMan,(int)pMan->pGroup[lVar11].iStart);
        if (*pcVar9 != -1) {
LAB_0050b51b:
          __assert_fail("Abc_TgIsInitPerm(pVars, pDirs, nGvars)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                        ,0x8b8,"int Abc_TgNextPermutation(Abc_TgMan_t *)");
        }
        if ('\x01' < cVar1) {
          lVar4 = 0;
          do {
            if ((pMan->pPermDir[lVar4 + lVar8 + 1] != -1) ||
               (pMan->pPerm[lVar4 + lVar8 + 1] < pMan->pPerm[lVar4 + lVar2 + -0x1c]))
            goto LAB_0050b51b;
            lVar4 = lVar4 + 1;
          } while (uVar10 - 1 != lVar4);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pMan->nGroups);
  }
  return 0;
}

Assistant:

static int Abc_TgNextPermutation(Abc_TgMan_t * pMan)
{
    int i, j, nGvars;
    TiedGroup * pGrp;
    char * pVars;
    signed char * pDirs;
    for (i = 0; i < pMan->nGroups; i++)
    {
        pGrp = pMan->pGroup + i;
        nGvars = pGrp->nGVars;
        if (nGvars == 1) continue;
        pVars = pMan->pPerm + pGrp->iStart;
        pDirs = pMan->pPermDir + pGrp->iStart;
        j = Abc_NextPermSwapC(pVars, pDirs, nGvars);
        if (j >= 0)
        {
            Abc_TgSwapAdjacentSymGroups(pMan, j + pGrp->iStart);
            return 1;
        }
        Abc_TgSwapAdjacentSymGroups(pMan, pGrp->iStart);
        assert(Abc_TgIsInitPerm(pVars, pDirs, nGvars));
    }
    return 0;
}